

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

void NGA_Gather_flat64(int g_a,void *v,int64_t *subsArray,int64_t n)

{
  Integer IVar1;
  void *subscript;
  long lVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  
  IVar1 = pnga_ndim((long)g_a);
  subscript = malloc((int)IVar1 * n * 8);
  if (subscript == (void *)0x0) {
    pnga_error("Memory allocation failed.",0);
  }
  if (0 < n) {
    lVar2 = (long)subscript + -8;
    lVar3 = 0;
    do {
      plVar4 = subsArray;
      lVar5 = IVar1;
      if (0 < IVar1) {
        do {
          *(long *)(lVar2 + lVar5 * 8) = *plVar4 + 1;
          lVar5 = lVar5 + -1;
          plVar4 = plVar4 + 1;
        } while (lVar5 != 0);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + IVar1 * 8;
      subsArray = subsArray + IVar1;
    } while (lVar3 != n);
  }
  pnga_gather((long)g_a,v,subscript,0,n);
  free(subscript);
  return;
}

Assistant:

void NGA_Gather_flat64(int g_a, void *v, int64_t subsArray[], int64_t n)
{
    int idx, i;
    Integer a = (Integer)g_a;
    Integer nv = (Integer)n;
    Integer ndim = wnga_ndim(a);
    Integer *_subs_array;
    _subs_array = (Integer *)malloc((int)ndim* n * sizeof(Integer));
    if(_subs_array == NULL) GA_Error("Memory allocation failed.", 0);

    /* adjust the indices for fortran interface */
    for(idx=0; idx<n; idx++)
        for(i=0; i<ndim; i++)
            _subs_array[idx*ndim+(ndim-i-1)] = subsArray[idx*ndim+i] + 1;
    
    wnga_gather(a, v, _subs_array, 0, nv);
    
    free(_subs_array);
}